

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sptk_utils.cc
# Opt level: O0

bool sptk::ConvertStringToInteger(string *input,int *output)

{
  int iVar1;
  ulong uVar2;
  char *__nptr;
  long lVar3;
  int *piVar4;
  undefined4 *in_RSI;
  char *in_RDI;
  int converted_value;
  char *end;
  char *local_20;
  undefined4 *local_18;
  char *local_10;
  
  local_18 = in_RSI;
  local_10 = in_RDI;
  uVar2 = std::__cxx11::string::empty();
  if (((uVar2 & 1) == 0) && (local_18 != (undefined4 *)0x0)) {
    __nptr = (char *)std::__cxx11::string::c_str();
    lVar3 = strtol(__nptr,&local_20,10);
    iVar1 = std::__cxx11::string::compare(local_10);
    if ((iVar1 != 0) && ((*local_20 == '\0' && (piVar4 = __errno_location(), *piVar4 != 0x22)))) {
      *local_18 = (int)lVar3;
      return true;
    }
  }
  return false;
}

Assistant:

bool ConvertStringToInteger(const std::string& input, int* output) {
  if (input.empty() || NULL == output) {
    return false;
  }

  char* end;
  int converted_value(static_cast<int>(std::strtol(input.c_str(), &end, 10)));

  if (0 == input.compare(end) || '\0' != *end || ERANGE == errno) {
    return false;
  }

  *output = converted_value;
  return true;
}